

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[40],char,char&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [40],
               char *params_1,char *params_2)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  long lVar5;
  String *result;
  String argValues [3];
  String *in_stack_ffffffffffffff78;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[40]>
            (&local_78,(kj *)params,(char (*) [40])CONCAT44(in_register_00000014,severity));
  cVar1 = *params_1;
  heapString(&local_60,1);
  if ((char *)local_60.content.size_ != (char *)0x0) {
    local_60.content.size_ = (size_t)local_60.content.ptr;
  }
  *(char *)local_60.content.size_ = cVar1;
  cVar1 = *params_2;
  heapString(&local_48,1);
  if ((char *)local_48.content.size_ != (char *)0x0) {
    local_48.content.size_ = (size_t)local_48.content.ptr;
  }
  *(char *)local_48.content.size_ = cVar1;
  argValues_00.size_ = (size_t)macroArgs;
  argValues_00.ptr = in_stack_ffffffffffffff78;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_78,argValues_00);
  lVar5 = 0x30;
  do {
    lVar2 = *(long *)((long)&local_78.content.ptr + lVar5);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&local_78.content.size_ + lVar5);
      *(undefined8 *)((long)&local_78.content.ptr + lVar5) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar5) = 0;
      puVar4 = *(undefined8 **)((long)&local_78.content.disposer + lVar5);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}